

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsFieldDescriptorSetFixedOrder
              (FmsFieldDescriptor fd,FmsFieldType field_type,FmsBasisType basis_type,FmsInt order)

{
  FmsComponent pFVar1;
  ulong uVar2;
  int iVar3;
  _FmsFieldDescriptor_FixedOrder *p_Var4;
  long lVar5;
  FmsInt FVar6;
  long lVar7;
  FmsInt FVar8;
  long local_68 [8];
  
  if (fd == (FmsFieldDescriptor)0x0) {
    iVar3 = 1;
  }
  else {
    pFVar1 = fd->component;
    if (pFVar1 == (FmsComponent)0x0) {
      iVar3 = 2;
    }
    else if ((fd->descriptor).any == (void *)0x0) {
      if (field_type < (FMS_HDIV|FMS_DISCONTINUOUS)) {
        uVar2 = pFVar1->dim;
        switch(field_type) {
        case FMS_CONTINUOUS:
          if (order == 0) {
            return 4;
          }
          local_68[1] = order - 1;
          local_68[0] = 1;
          local_68[2] = (order - 2) * local_68[1] >> 1;
          local_68[3] = local_68[1] * local_68[1];
          local_68[4] = ((order - 3) * local_68[2]) / 3;
          local_68[5] = local_68[1] * local_68[1] * local_68[1];
          local_68[6] = local_68[1] * local_68[2];
          local_68[7] = ((order * 2 + -3) * local_68[2]) / 3;
          break;
        default:
          local_68[1] = order + 1;
          local_68[0] = 1;
          local_68[2] = (order + 2) * local_68[1] >> 1;
          local_68[3] = local_68[1] * local_68[1];
          local_68[4] = ((order + 3) * local_68[2]) / 3;
          local_68[5] = local_68[1] * local_68[1] * local_68[1];
          local_68[6] = local_68[1] * local_68[2];
          local_68[7] = ((order * 2 + 3) * local_68[2]) / 3;
          for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
            if (*(ulong *)((long)FmsEntityDim + lVar5) < uVar2) {
              *(undefined8 *)((long)local_68 + lVar5) = 0;
            }
          }
          break;
        case FMS_HCURL:
          FmsAbortNotImplemented();
        case FMS_HDIV:
          lVar5 = order + 1;
          local_68[0] = 0;
          local_68[1] = 0;
          local_68[4] = 0;
          local_68[5] = 0;
          if (uVar2 == 2) {
            local_68[1] = lVar5;
            local_68[2] = lVar5 * order;
            lVar7 = order * 2;
          }
          else {
            local_68[2] = lVar5 * (order + 2) >> 1;
            local_68[4] = (order + 2) * lVar5 * order >> 1;
            local_68[5] = lVar5 * order * lVar5 * 3;
            lVar7 = lVar5;
          }
          local_68[3] = lVar7 * lVar5;
          local_68[6] = 0;
          local_68[7] = 0;
        }
        lVar5 = 8;
        FVar8 = 0;
        for (FVar6 = 0; FVar6 != pFVar1->num_parts; FVar6 = FVar6 + 1) {
          for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
            FVar8 = FVar8 + local_68[lVar7] *
                            *(long *)((long)pFVar1->parts->num_entities + lVar7 * 8 + lVar5 + -8);
          }
          lVar5 = lVar5 + 0xe8;
        }
        p_Var4 = (_FmsFieldDescriptor_FixedOrder *)malloc(0x10);
        if (p_Var4 == (_FmsFieldDescriptor_FixedOrder *)0x0) {
          iVar3 = 6;
        }
        else {
          p_Var4->field_type = field_type;
          p_Var4->basis_type = basis_type;
          p_Var4->order = order;
          fd->descr_type = FMS_FIXED_ORDER;
          (fd->descriptor).fixed_order = p_Var4;
          fd->num_dofs = FVar8;
          iVar3 = 0;
        }
      }
      else {
        iVar3 = 5;
      }
    }
    else {
      iVar3 = 3;
    }
  }
  return iVar3;
}

Assistant:

int FmsFieldDescriptorSetFixedOrder(FmsFieldDescriptor fd,
                                    FmsFieldType field_type,
                                    FmsBasisType basis_type, FmsInt order) {
  if (!fd) { E_RETURN(1); }
  FmsComponent comp = fd->component;
  if (!comp) { E_RETURN(2); }
  if (fd->descriptor.any != NULL) { E_RETURN(3); }
  FmsInt num_dofs = 0;
  // Count the number of dofs - based on component, field_type and order
  FmsInt ent_dofs[FMS_NUM_ENTITY_TYPES];
  const FmsInt dim = comp->dim;
  const FmsInt p = order;
  switch (field_type) {
  case FMS_CONTINUOUS: {
    const FmsInt pm1 = p-1, pm2 = p-2, pm3 = p-3;
    if (p <= 0) { E_RETURN(4); }
    ent_dofs[FMS_VERTEX] = 1;
    ent_dofs[FMS_EDGE] = pm1;
    ent_dofs[FMS_TRIANGLE] = (pm1*pm2)/2;
    ent_dofs[FMS_QUADRILATERAL] = pm1*pm1;
    ent_dofs[FMS_TETRAHEDRON] = (ent_dofs[FMS_TRIANGLE]*pm3)/3;
    ent_dofs[FMS_HEXAHEDRON] = ent_dofs[FMS_QUADRILATERAL]*pm1;
    ent_dofs[FMS_WEDGE] = ent_dofs[FMS_TRIANGLE]*pm1;
    ent_dofs[FMS_PYRAMID] = (ent_dofs[FMS_TRIANGLE]*(p+pm3))/3;
    break;
  }
  case FMS_DISCONTINUOUS:
  case FMS_DISCONTINUOUS_WEIGHTED: {
    const FmsInt pp1 = p+1, pp2 = p+2, pp3 = p+3;
    // if (p < 0) { E_RETURN(4); } // If we make FmsInt a signed type
    ent_dofs[FMS_VERTEX] = 1;
    ent_dofs[FMS_EDGE] = pp1;
    ent_dofs[FMS_TRIANGLE] = (pp1*pp2)/2;
    ent_dofs[FMS_QUADRILATERAL] = pp1*pp1;
    ent_dofs[FMS_TETRAHEDRON] = (ent_dofs[FMS_TRIANGLE]*pp3)/3;
    ent_dofs[FMS_HEXAHEDRON] = ent_dofs[FMS_QUADRILATERAL]*pp1;
    ent_dofs[FMS_WEDGE] = ent_dofs[FMS_TRIANGLE]*pp1;
    ent_dofs[FMS_PYRAMID] = (ent_dofs[FMS_TRIANGLE]*(p+pp3))/3;
    for (FmsInt et = 0; et < FMS_NUM_ENTITY_TYPES; et++) {
      if (FmsEntityDim[et] < dim) {
        ent_dofs[et] = 0;
      }
    }
    break;
  }
  case FMS_HCURL: {
    FmsAbortNotImplemented();
    break;
  }
  case FMS_HDIV: {
    const FmsInt pp1 = p + 1, pp2 = p + 2;
    ent_dofs[FMS_VERTEX] = 0;
    ent_dofs[FMS_EDGE] = 0;
    ent_dofs[FMS_TETRAHEDRON] = 0;
    ent_dofs[FMS_HEXAHEDRON] = 0;
    if(dim == 2) {
      ent_dofs[FMS_EDGE] = pp1;
      ent_dofs[FMS_TRIANGLE] = p*pp1;
      ent_dofs[FMS_QUADRILATERAL] = 2*p*pp1;
    } else {
      ent_dofs[FMS_TRIANGLE] = pp1*pp2/2;
      ent_dofs[FMS_QUADRILATERAL] = pp1*pp1;
      ent_dofs[FMS_TETRAHEDRON] = p*pp1*(p + 2)/2;
      ent_dofs[FMS_HEXAHEDRON] = 3*p*pp1*pp1;
    }
    ent_dofs[FMS_WEDGE] = 0;
    ent_dofs[FMS_PYRAMID] = 0;
    break;
  }
  default: E_RETURN(5);
  }
  // Count the dofs part by part
  for (FmsInt i = 0; i < comp->num_parts; i++) {
    for (FmsInt et = 0; et < FMS_NUM_ENTITY_TYPES; et++) {
      num_dofs += comp->parts[i].num_entities[et] * ent_dofs[et];
    }
  }

  // Construct fixed-order descriptor
  struct _FmsFieldDescriptor_FixedOrder *fo;
  fo = malloc(sizeof(*fo));
  if (fo == NULL) { E_RETURN(6); }
  fo->field_type = field_type;
  fo->basis_type = basis_type;
  fo->order = order;
  // Update fd
  fd->descr_type = FMS_FIXED_ORDER;
  fd->descriptor.fixed_order = fo;
  fd->num_dofs = num_dofs;
  return 0;
}